

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_NtkParseInt(char *pStr,Ifn_Ntk_t *p)

{
  int iVar1;
  int local_2c;
  char *pcStack_28;
  int iNode;
  char *pFinal;
  Ifn_Ntk_t *p_local;
  char *pStr_local;
  
  pFinal = (char *)p;
  p_local = (Ifn_Ntk_t *)pStr;
  iVar1 = Ifn_ManStrCheck(pStr,&p->nInps,&p->nObjs);
  if (iVar1 == 0) {
    pStr_local._4_4_ = 0;
  }
  else if (*(int *)pFinal < 0xc) {
    if ((((*(int *)pFinal < 2) || (*(int *)(pFinal + 4) <= *(int *)pFinal)) ||
        (0xb < *(int *)pFinal)) || (0x15 < *(int *)(pFinal + 4))) {
      __assert_fail("p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifTune.c"
                    ,0x124,"int Ifn_NtkParseInt(char *, Ifn_Ntk_t *)");
    }
    iVar1 = Inf_ManOpenSymb((char *)p_local);
    if (iVar1 == 0) {
      pStr_local._4_4_ =
           Ifn_ErrorMessage("The first symbol should be one of the symbols: (, [, <, {.\n");
    }
    else {
      local_2c = *(int *)pFinal;
      iVar1 = Ifn_NtkParseInt_rec((char *)p_local,(Ifn_Ntk_t *)pFinal,&stack0xffffffffffffffd8,
                                  &local_2c);
      if (iVar1 == 0) {
        pStr_local._4_4_ = 0;
      }
      else if ((*pcStack_28 == '\0') || (*pcStack_28 == ';')) {
        if (local_2c == *(int *)(pFinal + 4)) {
          pStr_local._4_4_ = 1;
        }
        else {
          pStr_local._4_4_ = Ifn_ErrorMessage("Mismatch in the number of nodes.\n");
        }
      }
      else {
        pStr_local._4_4_ = Ifn_ErrorMessage("The last symbol should be \';\'.\n");
      }
    }
  }
  else {
    pStr_local._4_4_ =
         Ifn_ErrorMessage("The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n"
                          ,(ulong)*(uint *)pFinal,0xb);
  }
  return pStr_local._4_4_;
}

Assistant:

int Ifn_NtkParseInt( char * pStr, Ifn_Ntk_t * p )
{
    char * pFinal; int iNode;
    if ( !Ifn_ManStrCheck(pStr, &p->nInps, &p->nObjs) )
        return 0;
    if ( p->nInps > IFN_INS )
        return Ifn_ErrorMessage( "The number of variables (%d) exceeds predefined limit (%d). Recompile with different value of IFN_INS.\n", p->nInps, IFN_INS );
    assert( p->nInps > 1 && p->nInps < p->nObjs && p->nInps <= IFN_INS && p->nObjs < 2*IFN_INS );
    if ( !Inf_ManOpenSymb(pStr) )
        return Ifn_ErrorMessage( "The first symbol should be one of the symbols: (, [, <, {.\n" );
    iNode = p->nInps;
    if ( !Ifn_NtkParseInt_rec( pStr, p, &pFinal, &iNode ) )
        return 0;
    if ( pFinal[0] && pFinal[0] != ';' )
        return Ifn_ErrorMessage( "The last symbol should be \';\'.\n" );
    if ( iNode != p->nObjs )
        return Ifn_ErrorMessage( "Mismatch in the number of nodes.\n" );
    return 1;
}